

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

shared_ptr<minja::TemplateNode> __thiscall
minja::Parser::parseTemplate
          (Parser *this,TemplateTokenIterator *begin,TemplateTokenIterator *it,
          TemplateTokenIterator *end,bool fully)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  pointer pTVar5;
  ulong uVar6;
  char *pcVar7;
  runtime_error *prVar8;
  long lVar9;
  undefined8 uVar10;
  size_type sVar11;
  element_type *this_00;
  TemplateTokenIterator *in_RCX;
  Parser *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  TemplateTokenIterator *in_R8;
  byte in_R9B;
  shared_ptr<minja::TemplateNode> sVar12;
  LoopControlTemplateToken *ctrl_token;
  shared_ptr<minja::TemplateNode> body_3;
  FilterTemplateToken *filter_token;
  shared_ptr<minja::TemplateNode> body_2;
  MacroTemplateToken *macro_token;
  value_type *name;
  shared_ptr<minja::TemplateNode> value_template;
  SetTemplateToken *set_token;
  ExpressionTemplateToken *expr_token;
  size_type i_1;
  size_type i;
  string text;
  SpaceHandling post_space;
  SpaceHandling pre_space;
  TextTemplateToken *text_token;
  shared_ptr<minja::TemplateNode> body_1;
  shared_ptr<minja::TemplateNode> else_body;
  shared_ptr<minja::TemplateNode> body;
  ForTemplateToken *for_token;
  ElifTemplateToken *elif_token;
  vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
  cascade;
  IfTemplateToken *if_token;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *token;
  TemplateTokenIterator start;
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  children;
  shared_ptr<minja::SequenceNode> *in_stack_fffffffffffff9d8;
  shared_ptr<minja::TemplateNode> *in_stack_fffffffffffff9e0;
  shared_ptr<minja::Expression> *in_stack_fffffffffffff9e8;
  Location *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  Location *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  Location *in_stack_fffffffffffffa18;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffa20;
  shared_ptr<minja::Expression> *in_stack_fffffffffffffa28;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *in_stack_fffffffffffffa30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa38;
  Location *in_stack_fffffffffffffa40;
  long local_5b8;
  long local_5a8;
  bool *in_stack_fffffffffffffa60;
  shared_ptr<minja::TemplateNode> *in_stack_fffffffffffffa68;
  long local_588;
  pointer in_stack_fffffffffffffa80;
  Parser *in_stack_fffffffffffffa88;
  long local_568;
  long local_558;
  long local_548;
  long local_520;
  long local_4f8;
  long local_4c0;
  long local_4b0;
  long local_488;
  SpaceHandling local_440;
  SpaceHandling local_43c;
  long local_438;
  long local_410;
  long local_3e0;
  undefined8 local_3a8;
  long local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  undefined8 local_318;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_300;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *local_2f8;
  long local_2e0;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_2c8 [3];
  long local_2b0;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_298 [3];
  long local_280;
  reference local_268;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_260 [5];
  long local_238;
  long local_220;
  long local_208;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_200;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *local_1f8;
  string local_1f0 [32];
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *local_1d0;
  long local_1c8;
  string local_1c0 [32];
  string local_1a0 [36];
  SpaceHandling local_17c;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_178;
  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *local_170;
  SpaceHandling local_164;
  long local_160;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_158 [5];
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_130 [3];
  shared_ptr<minja::TemplateNode> local_118 [2];
  long local_f8;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_e0 [3];
  undefined8 local_c8;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_b0;
  undefined8 local_a8;
  long local_68;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_60;
  reference local_58;
  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
  local_50 [3];
  undefined1 in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  
  bVar1 = in_R9B & 1;
  std::
  vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
  ::vector((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
            *)0x2e520b);
LAB_002e520b:
  do {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                        *)in_stack_fffffffffffff9e0,
                       (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                        *)in_stack_fffffffffffff9d8);
    if (!bVar2) {
LAB_002e73ac:
      if (((bVar1 & 1) != 0) &&
         (bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9e0,
                             (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9d8), bVar2)) {
        uVar10 = __cxa_allocate_exception(0x10);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(in_RCX);
        std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::operator*
                  ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   in_stack_fffffffffffff9e0);
        unexpected(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
        __cxa_throw(uVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      bVar2 = std::
              vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
              ::empty((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                       *)in_stack_fffffffffffff9f0);
      if (bVar2) {
        std::
        shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff9e0,
                     (shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_stack_fffffffffffff9d8);
        local_318 = 0;
        __args_1 = &local_348;
        std::__cxx11::string::string((string *)__args_1);
        std::make_shared<minja::TextNode,minja::Location,std::__cxx11::string>
                  (in_stack_fffffffffffffa08,__args_1);
        std::shared_ptr<minja::TemplateNode>::shared_ptr<minja::TextNode,void>
                  (in_stack_fffffffffffff9e0,
                   (shared_ptr<minja::TextNode> *)in_stack_fffffffffffff9d8);
        std::shared_ptr<minja::TextNode>::~shared_ptr((shared_ptr<minja::TextNode> *)0x2e74e5);
        std::__cxx11::string::~string((string *)&local_348);
        Location::~Location((Location *)0x2e74ff);
      }
      else {
        sVar11 = std::
                 vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                 ::size((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                         *)(local_50 + 1));
        if (sVar11 == 1) {
          std::
          vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
          ::operator[]((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                        *)(local_50 + 1),0);
          std::shared_ptr<minja::TemplateNode>::shared_ptr
                    (in_stack_fffffffffffff9e0,
                     (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffff9d8);
        }
        else {
          std::
          vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
          ::operator[]((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                        *)(local_50 + 1),0);
          this_00 = std::
                    __shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x2e759c);
          in_stack_fffffffffffff9f0 = TemplateNode::location(this_00);
          std::
          make_shared<minja::SequenceNode,minja::Location_const&,std::vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>>
                    (in_stack_fffffffffffffa08,
                     (vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                      *)in_stack_fffffffffffffa00);
          std::shared_ptr<minja::TemplateNode>::shared_ptr<minja::SequenceNode,void>
                    (in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
          std::shared_ptr<minja::SequenceNode>::~shared_ptr
                    ((shared_ptr<minja::SequenceNode> *)0x2e75e9);
        }
      }
      std::
      vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
      ::~vector((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                 *)in_stack_fffffffffffff9f0);
      sVar12.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      sVar12.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (shared_ptr<minja::TemplateNode>)
             sVar12.super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>;
    }
    local_50[0]._M_current = in_RCX->_M_current;
    local_60 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
               ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                             *)in_stack_fffffffffffff9e8,
                            (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
    local_58 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
               ::operator*(&local_60);
    pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::get
                       ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)in_stack_fffffffffffff9e0);
    if (pTVar5 == (pointer)0x0) {
      local_388 = 0;
    }
    else {
      local_388 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,&IfTemplateToken::typeinfo,0);
    }
    local_68 = local_388;
    if (local_388 != 0) {
      std::
      vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
      ::vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                *)0x2e52e4);
      parseTemplate(in_RDX,in_RCX,in_R8,
                    (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                    (bool)in_stack_ffffffffffffffcf);
      std::
      vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
      ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                ((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                  *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0);
      std::shared_ptr<minja::TemplateNode>::~shared_ptr((shared_ptr<minja::TemplateNode> *)0x2e5356)
      ;
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                            *)in_stack_fffffffffffff9d8);
        bVar2 = false;
        if (bVar3) {
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
          ::operator*(in_RCX);
          pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)0x2e5392);
          bVar2 = pTVar5->type == Elif;
        }
        if (!bVar2) break;
        local_b0 = __gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                   ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                 *)in_stack_fffffffffffff9e8,
                                (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(&local_b0);
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )in_stack_fffffffffffff9e0);
        if (pTVar5 == (pointer)0x0) {
          local_3a8 = 0;
        }
        else {
          local_3a8 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,&ElifTemplateToken::typeinfo,0)
          ;
        }
        local_a8 = local_3a8;
        parseTemplate(in_RDX,in_RCX,in_R8,
                      (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                      (bool)in_stack_ffffffffffffffcf);
        std::
        vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
        ::emplace_back<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                  ((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                    *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0)
        ;
        std::shared_ptr<minja::TemplateNode>::~shared_ptr
                  ((shared_ptr<minja::TemplateNode> *)0x2e54e0);
      }
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9e0,
                         (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9d8);
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(in_RCX);
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)0x2e553e);
        if (pTVar5->type == Else) {
          local_c8 = 0;
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
          ::operator++(in_RCX);
          parseTemplate(in_RDX,in_RCX,in_R8,
                        (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                        (bool)in_stack_ffffffffffffffcf);
          std::
          vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>
          ::emplace_back<decltype(nullptr),std::shared_ptr<minja::TemplateNode>>
                    ((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                      *)in_stack_fffffffffffff9f0,(void **)in_stack_fffffffffffff9e8,
                     in_stack_fffffffffffff9e0);
          std::shared_ptr<minja::TemplateNode>::~shared_ptr
                    ((shared_ptr<minja::TemplateNode> *)0x2e55ca);
        }
      }
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9e0,
                         (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9d8);
      bVar2 = true;
      if (!bVar3) {
        local_e0[0] = __gnu_cxx::
                      __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                      ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                    *)in_stack_fffffffffffff9e8,
                                   (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(local_e0);
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)0x2e5643);
        bVar2 = pTVar5->type != EndIf;
      }
      if (bVar2) {
        uVar10 = __cxa_allocate_exception(0x10);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(local_50);
        std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::operator*
                  ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   in_stack_fffffffffffff9e0);
        unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
        __cxa_throw(uVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::operator->
                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 0x2e5704);
      std::
      make_shared<minja::IfNode,minja::Location&,std::vector<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>,std::allocator<std::pair<std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>>>>
                (in_stack_fffffffffffffa08,
                 (vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                  *)in_stack_fffffffffffffa00);
      std::
      vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
      ::emplace_back<std::shared_ptr<minja::IfNode>>
                ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                  *)in_stack_fffffffffffff9f0,(shared_ptr<minja::IfNode> *)in_stack_fffffffffffff9e8
                );
      std::shared_ptr<minja::IfNode>::~shared_ptr((shared_ptr<minja::IfNode> *)0x2e5746);
      std::
      vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
      ::~vector((vector<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>,_std::allocator<std::pair<std::shared_ptr<minja::Expression>,_std::shared_ptr<minja::TemplateNode>_>_>_>
                 *)in_stack_fffffffffffff9f0);
      goto LAB_002e520b;
    }
    pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::get
                       ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         *)in_stack_fffffffffffff9e0);
    if (pTVar5 == (pointer)0x0) {
      local_3e0 = 0;
    }
    else {
      local_3e0 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,&ForTemplateToken::typeinfo,0);
    }
    local_f8 = local_3e0;
    if (local_3e0 == 0) {
      pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
               get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   in_stack_fffffffffffff9e0);
      if (pTVar5 == (pointer)0x0) {
        local_410 = 0;
      }
      else {
        local_410 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                   &GenerationTemplateToken::typeinfo,0);
      }
      if (local_410 == 0) {
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )in_stack_fffffffffffff9e0);
        if (pTVar5 == (pointer)0x0) {
          local_438 = 0;
        }
        else {
          local_438 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,&TextTemplateToken::typeinfo,0)
          ;
        }
        local_160 = local_438;
        if (local_438 == 0) {
          pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)in_stack_fffffffffffff9e0);
          if (pTVar5 == (pointer)0x0) {
            local_4b0 = 0;
          }
          else {
            local_4b0 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                       &ExpressionTemplateToken::typeinfo,0);
          }
          local_220 = local_4b0;
          if (local_4b0 == 0) {
            pTVar5 = std::
                     unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                     get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                          *)in_stack_fffffffffffff9e0);
            if (pTVar5 == (pointer)0x0) {
              local_4c0 = 0;
            }
            else {
              local_4c0 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,&SetTemplateToken::typeinfo
                                         ,0);
            }
            local_238 = local_4c0;
            if (local_4c0 == 0) {
              pTVar5 = std::
                       unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                       ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                              *)in_stack_fffffffffffff9e0);
              if (pTVar5 == (pointer)0x0) {
                local_4f8 = 0;
              }
              else {
                local_4f8 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                           &MacroTemplateToken::typeinfo,0);
              }
              local_280 = local_4f8;
              if (local_4f8 == 0) {
                pTVar5 = std::
                         unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)in_stack_fffffffffffff9e0);
                if (pTVar5 == (pointer)0x0) {
                  local_520 = 0;
                }
                else {
                  local_520 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                             &FilterTemplateToken::typeinfo,0);
                }
                local_2b0 = local_520;
                if (local_520 == 0) {
                  pTVar5 = std::
                           unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                  *)in_stack_fffffffffffff9e0);
                  if (pTVar5 == (pointer)0x0) {
                    local_548 = 0;
                  }
                  else {
                    local_548 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                               &CommentTemplateToken::typeinfo,0);
                  }
                  if (local_548 == 0) {
                    pTVar5 = std::
                             unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                    *)in_stack_fffffffffffff9e0);
                    if (pTVar5 == (pointer)0x0) {
                      local_558 = 0;
                    }
                    else {
                      local_558 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                 &LoopControlTemplateToken::typeinfo,0);
                    }
                    local_2e0 = local_558;
                    if (local_558 == 0) {
                      pTVar5 = std::
                               unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                               ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      *)in_stack_fffffffffffff9e0);
                      if (pTVar5 == (pointer)0x0) {
                        local_568 = 0;
                      }
                      else {
                        local_568 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                   &EndForTemplateToken::typeinfo,0);
                      }
                      if (local_568 == 0) {
                        pTVar5 = std::
                                 unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                        *)in_stack_fffffffffffff9e0);
                        if (pTVar5 == (pointer)0x0) {
                          in_stack_fffffffffffffa88 = (Parser *)0x0;
                        }
                        else {
                          in_stack_fffffffffffffa88 =
                               (Parser *)
                               __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                              &EndSetTemplateToken::typeinfo,0);
                        }
                        if (in_stack_fffffffffffffa88 == (Parser *)0x0) {
                          in_stack_fffffffffffffa80 =
                               std::
                               unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                               ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      *)in_stack_fffffffffffff9e0);
                          if (in_stack_fffffffffffffa80 == (pointer)0x0) {
                            local_588 = 0;
                          }
                          else {
                            local_588 = __dynamic_cast(in_stack_fffffffffffffa80,
                                                       &TemplateToken::typeinfo,
                                                       &EndMacroTemplateToken::typeinfo,0);
                          }
                          if (local_588 == 0) {
                            pTVar5 = std::
                                     unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                     ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                            *)in_stack_fffffffffffff9e0);
                            if (pTVar5 == (pointer)0x0) {
                              lVar9 = 0;
                            }
                            else {
                              lVar9 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                     &EndFilterTemplateToken::typeinfo,0);
                            }
                            if (lVar9 == 0) {
                              pTVar5 = std::
                                       unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                       ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                              *)in_stack_fffffffffffff9e0);
                              if (pTVar5 == (pointer)0x0) {
                                local_5a8 = 0;
                              }
                              else {
                                local_5a8 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                           &EndIfTemplateToken::typeinfo,0);
                              }
                              if (local_5a8 == 0) {
                                pTVar5 = std::
                                         unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                         ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                *)in_stack_fffffffffffff9e0);
                                if (pTVar5 == (pointer)0x0) {
                                  local_5b8 = 0;
                                }
                                else {
                                  local_5b8 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                             &ElseTemplateToken::typeinfo,0);
                                }
                                if (local_5b8 == 0) {
                                  pTVar5 = std::
                                           unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                           ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff9e0);
                                  if (pTVar5 == (pointer)0x0) {
                                    lVar9 = 0;
                                  }
                                  else {
                                    lVar9 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                           &EndGenerationTemplateToken::typeinfo,0);
                                  }
                                  if (lVar9 == 0) {
                                    pTVar5 = std::
                                             unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                             ::get((
                                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff9e0);
                                    if (pTVar5 == (pointer)0x0) {
                                      lVar9 = 0;
                                    }
                                    else {
                                      lVar9 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                                             &ElifTemplateToken::typeinfo,0);
                                    }
                                    if (lVar9 == 0) {
                                      uVar10 = __cxa_allocate_exception(0x10);
                                      local_300 = __gnu_cxx::
                                                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                                  ::operator-((
                                                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                                  *)in_stack_fffffffffffff9e8,
                                                  (difference_type)in_stack_fffffffffffff9e0);
                                      __gnu_cxx::
                                      __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                      ::operator*(&local_300);
                                      std::
                                      unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                      ::operator*((
                                                  unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                                  *)in_stack_fffffffffffff9e0);
                                      unexpected(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80
                                                );
                                      __cxa_throw(uVar10,&std::runtime_error::typeinfo,
                                                  std::runtime_error::~runtime_error);
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      local_2f8 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                   *)__gnu_cxx::
                                     __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                     ::operator--((
                                                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                                  *)in_stack_fffffffffffff9e8,
                                                  (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                      goto LAB_002e73ac;
                    }
                    std::
                    unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                    operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)0x2e6f8f);
                    std::
                    make_shared<minja::LoopControlNode,minja::Location&,minja::LoopControlType&>
                              (in_stack_fffffffffffffa08,
                               (LoopControlType *)in_stack_fffffffffffffa00);
                    std::
                    vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                    ::emplace_back<std::shared_ptr<minja::LoopControlNode>>
                              ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                                *)in_stack_fffffffffffff9f0,
                               (shared_ptr<minja::LoopControlNode> *)in_stack_fffffffffffff9e8);
                    std::shared_ptr<minja::LoopControlNode>::~shared_ptr
                              ((shared_ptr<minja::LoopControlNode> *)0x2e6fd5);
                  }
                }
                else {
                  parseTemplate(in_RDX,in_RCX,in_R8,
                                (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                                (bool)in_stack_ffffffffffffffcf);
                  bVar3 = __gnu_cxx::operator==
                                    ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                      *)in_stack_fffffffffffff9e0,
                                     (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                      *)in_stack_fffffffffffff9d8);
                  bVar2 = true;
                  if (!bVar3) {
                    local_2c8[0] = __gnu_cxx::
                                   __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                   ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                                 *)in_stack_fffffffffffff9e8,
                                                (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                    __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                    ::operator*(local_2c8);
                    pTVar5 = std::
                             unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                           *)0x2e6d47);
                    bVar2 = pTVar5->type != EndFilter;
                  }
                  if (bVar2) {
                    uVar10 = __cxa_allocate_exception(0x10);
                    __gnu_cxx::
                    __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                    ::operator*(local_50);
                    std::
                    unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                    operator*((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                               *)in_stack_fffffffffffff9e0);
                    unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
                    __cxa_throw(uVar10,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)0x2e6e21);
                  std::
                  make_shared<minja::FilterNode,minja::Location&,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>>
                            (in_stack_fffffffffffffa18,
                             (shared_ptr<minja::Expression> *)in_stack_fffffffffffffa10,
                             (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffffa08);
                  std::
                  vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                  ::emplace_back<std::shared_ptr<minja::FilterNode>>
                            ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                              *)in_stack_fffffffffffff9f0,
                             (shared_ptr<minja::FilterNode> *)in_stack_fffffffffffff9e8);
                  std::shared_ptr<minja::FilterNode>::~shared_ptr
                            ((shared_ptr<minja::FilterNode> *)0x2e6e6f);
                  std::shared_ptr<minja::TemplateNode>::~shared_ptr
                            ((shared_ptr<minja::TemplateNode> *)0x2e6e7c);
                }
              }
              else {
                parseTemplate(in_RDX,in_RCX,in_R8,
                              (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                              (bool)in_stack_ffffffffffffffcf);
                bVar3 = __gnu_cxx::operator==
                                  ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                    *)in_stack_fffffffffffff9e0,
                                   (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                    *)in_stack_fffffffffffff9d8);
                bVar2 = true;
                if (!bVar3) {
                  local_298[0] = __gnu_cxx::
                                 __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                 ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                               *)in_stack_fffffffffffff9e8,
                                              (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                  __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                  ::operator*(local_298);
                  pTVar5 = std::
                           unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                         *)0x2e6ae1);
                  bVar2 = pTVar5->type != EndMacro;
                }
                if (bVar2) {
                  uVar10 = __cxa_allocate_exception(0x10);
                  __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                  ::operator*(local_50);
                  std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ::operator*((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                               *)in_stack_fffffffffffff9e0);
                  unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
                  __cxa_throw(uVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)0x2e6bbb);
                std::
                make_shared<minja::MacroNode,minja::Location&,std::shared_ptr<minja::VariableExpr>,std::vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>,std::shared_ptr<minja::TemplateNode>>
                          (in_stack_fffffffffffffa18,
                           (shared_ptr<minja::VariableExpr> *)in_stack_fffffffffffffa10,
                           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                            *)in_stack_fffffffffffffa08,
                           (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffffa00);
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::MacroNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                            *)in_stack_fffffffffffff9f0,
                           (shared_ptr<minja::MacroNode> *)in_stack_fffffffffffff9e8);
                std::shared_ptr<minja::MacroNode>::~shared_ptr
                          ((shared_ptr<minja::MacroNode> *)0x2e6c10);
                std::shared_ptr<minja::TemplateNode>::~shared_ptr
                          ((shared_ptr<minja::TemplateNode> *)0x2e6c1d);
              }
            }
            else {
              bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(local_4c0 + 0x68));
              if (bVar2) {
                std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)0x2e6661);
                std::
                make_shared<minja::SetNode,minja::Location&,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::shared_ptr<minja::Expression>>
                          (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffa08,
                           (shared_ptr<minja::Expression> *)in_stack_fffffffffffffa00);
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::SetNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                            *)in_stack_fffffffffffff9f0,
                           (shared_ptr<minja::SetNode> *)in_stack_fffffffffffff9e8);
                std::shared_ptr<minja::SetNode>::~shared_ptr((shared_ptr<minja::SetNode> *)0x2e66b5)
                ;
              }
              else {
                parseTemplate(in_RDX,in_RCX,in_R8,
                              (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                              (bool)in_stack_ffffffffffffffcf);
                bVar3 = __gnu_cxx::operator==
                                  ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                    *)in_stack_fffffffffffff9e0,
                                   (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                    *)in_stack_fffffffffffff9d8);
                bVar2 = true;
                if (!bVar3) {
                  local_260[0] = __gnu_cxx::
                                 __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                 ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                               *)in_stack_fffffffffffff9e8,
                                              (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
                  __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                  ::operator*(local_260);
                  pTVar5 = std::
                           unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                         *)0x2e6763);
                  bVar2 = pTVar5->type != EndSet;
                }
                if (bVar2) {
                  uVar10 = __cxa_allocate_exception(0x10);
                  __gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                  ::operator*(local_50);
                  std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                  ::operator*((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                               *)in_stack_fffffffffffff9e0);
                  unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
                  __cxa_throw(uVar10,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                uVar6 = std::__cxx11::string::empty();
                if ((uVar6 & 1) == 0) {
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar8,"Namespaced set not supported in set with template value");
                  __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                sVar11 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)(local_238 + 0x50));
                if (sVar11 != 1) {
                  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error
                            (prVar8,"Structural assignment not supported in set with template value"
                            );
                  __cxa_throw(prVar8,&std::runtime_error::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_268 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          *)(local_238 + 0x50),0);
                std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                            *)0x2e695e);
                std::
                make_shared<minja::SetTemplateNode,minja::Location&,std::__cxx11::string&,std::shared_ptr<minja::TemplateNode>>
                          (in_stack_fffffffffffffa18,in_stack_fffffffffffffa10,
                           (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffffa08);
                std::
                vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
                ::emplace_back<std::shared_ptr<minja::SetTemplateNode>>
                          ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                            *)in_stack_fffffffffffff9f0,
                           (shared_ptr<minja::SetTemplateNode> *)in_stack_fffffffffffff9e8);
                std::shared_ptr<minja::SetTemplateNode>::~shared_ptr
                          ((shared_ptr<minja::SetTemplateNode> *)0x2e69a8);
                std::shared_ptr<minja::TemplateNode>::~shared_ptr
                          ((shared_ptr<minja::TemplateNode> *)0x2e69b5);
              }
            }
          }
          else {
            std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
            operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                        *)0x2e655a);
            std::
            make_shared<minja::ExpressionNode,minja::Location&,std::shared_ptr<minja::Expression>>
                      (in_stack_fffffffffffffa08,
                       (shared_ptr<minja::Expression> *)in_stack_fffffffffffffa00);
            std::
            vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
            ::emplace_back<std::shared_ptr<minja::ExpressionNode>>
                      ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                        *)in_stack_fffffffffffff9f0,
                       (shared_ptr<minja::ExpressionNode> *)in_stack_fffffffffffff9e8);
            std::shared_ptr<minja::ExpressionNode>::~shared_ptr
                      ((shared_ptr<minja::ExpressionNode> *)0x2e65a0);
          }
        }
        else {
          local_170 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                       *)__gnu_cxx::
                         __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                         ::operator-((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                      *)in_stack_fffffffffffff9e8,
                                     (difference_type)in_stack_fffffffffffff9e0);
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9e0,
                             (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9d8);
          if (bVar2) {
            local_178 = __gnu_cxx::
                        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                        ::operator-((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                     *)in_stack_fffffffffffff9e8,
                                    (difference_type)in_stack_fffffffffffff9e0);
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
            ::operator*(&local_178);
            pTVar5 = std::
                     unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                     operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)0x2e5db6);
            local_43c = pTVar5->post_space;
          }
          else {
            local_43c = Keep;
          }
          local_164 = local_43c;
          bVar2 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9e0,
                             (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9d8);
          if (bVar2) {
            __gnu_cxx::
            __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
            ::operator*(in_RCX);
            pTVar5 = std::
                     unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                     operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)0x2e5e0b);
            local_440 = pTVar5->pre_space;
          }
          else {
            local_440 = Keep;
          }
          local_17c = local_440;
          std::__cxx11::string::string(local_1a0,(string *)(local_160 + 0x30));
          if (local_17c == Strip) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::trailing_space_regex_abi_cxx11_ == '\0') &&
               (iVar4 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::trailing_space_regex_abi_cxx11_), iVar4 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,
                         (flag_type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::trailing_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::trailing_space_regex_abi_cxx11_);
            }
            std::
            regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                      (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                       (char *)in_stack_fffffffffffffa28,
                       (match_flag_type)((ulong)in_stack_fffffffffffffa20 >> 0x20));
            std::__cxx11::string::operator=(local_1a0,local_1c0);
            std::__cxx11::string::~string(local_1c0);
          }
          else if (((*(byte *)(in_RSI + 0x29) & 1) != 0) &&
                  (bVar2 = __gnu_cxx::operator!=
                                     ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                       *)in_stack_fffffffffffff9e0,
                                      (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                       *)in_stack_fffffffffffff9d8), bVar2)) {
            local_1c8 = std::__cxx11::string::size();
            while( true ) {
              bVar2 = false;
              if (local_1c8 != 0) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
                bVar2 = true;
                if (*pcVar7 != ' ') {
                  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
                  bVar2 = *pcVar7 == '\t';
                }
              }
              if (!bVar2) break;
              local_1c8 = local_1c8 + -1;
            }
            if (local_1c8 == 0) {
              local_1d0 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           *)__gnu_cxx::
                             __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                             ::operator-((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                          *)in_stack_fffffffffffff9e8,
                                         (difference_type)in_stack_fffffffffffff9e0);
              bVar3 = __gnu_cxx::operator==
                                ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                  *)in_stack_fffffffffffff9e0,
                                 (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                  *)in_stack_fffffffffffff9d8);
              bVar2 = true;
              if (!bVar3) goto LAB_002e6093;
            }
            else {
LAB_002e6093:
              bVar2 = false;
              if (local_1c8 != 0) {
                pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0);
                bVar2 = *pcVar7 == '\n';
              }
            }
            if (bVar2) {
              std::__cxx11::string::resize((ulong)local_1a0);
            }
          }
          if (local_164 == Strip) {
            if ((parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                 ::leading_space_regex_abi_cxx11_ == '\0') &&
               (iVar4 = __cxa_guard_acquire(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                             ::leading_space_regex_abi_cxx11_), iVar4 != 0)) {
              std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                        (in_stack_fffffffffffffa20,(char *)in_stack_fffffffffffffa18,
                         (flag_type)((ulong)in_stack_fffffffffffffa10 >> 0x20));
              __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::
                           ~basic_regex,
                           &parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                            ::leading_space_regex_abi_cxx11_,&__dso_handle);
              __cxa_guard_release(&parseTemplate(__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>&,__gnu_cxx::__normal_iterator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>const*,std::vector<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>,std::allocator<std::unique_ptr<minja::TemplateToken,std::default_delete<minja::TemplateToken>>>>>const&,bool)
                                   ::leading_space_regex_abi_cxx11_);
            }
            std::
            regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                      (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,
                       (char *)in_stack_fffffffffffffa28,
                       (match_flag_type)((ulong)in_stack_fffffffffffffa20 >> 0x20));
            std::__cxx11::string::operator=(local_1a0,local_1f0);
            std::__cxx11::string::~string(local_1f0);
          }
          else {
            bVar2 = false;
            if ((*(byte *)(in_RSI + 0x28) & 1) != 0) {
              local_1f8 = (unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                           *)__gnu_cxx::
                             __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                             ::operator-((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                          *)in_stack_fffffffffffff9e8,
                                         (difference_type)in_stack_fffffffffffff9e0);
              bVar3 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                  *)in_stack_fffffffffffff9e0,
                                 (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                  *)in_stack_fffffffffffff9d8);
              bVar2 = false;
              if (bVar3) {
                local_200 = __gnu_cxx::
                            __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                            ::operator-((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                         *)in_stack_fffffffffffff9e8,
                                        (difference_type)in_stack_fffffffffffff9e0);
                __gnu_cxx::
                __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                ::operator*(&local_200);
                pTVar5 = std::
                         unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                         ::get((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                *)in_stack_fffffffffffff9e0);
                if (pTVar5 == (pointer)0x0) {
                  local_488 = 0;
                }
                else {
                  local_488 = __dynamic_cast(pTVar5,&TemplateToken::typeinfo,
                                             &ExpressionTemplateToken::typeinfo,0);
                }
                bVar2 = local_488 == 0;
              }
            }
            if (((bVar2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) &&
               (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0), *pcVar7 == '\n'
               )) {
              std::__cxx11::string::erase((ulong)local_1a0,0);
            }
          }
          bVar2 = __gnu_cxx::operator==
                            ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9e0,
                             (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                              *)in_stack_fffffffffffff9d8);
          if (((bVar2) && ((*(byte *)(in_RSI + 0x2a) & 1) == 0)) &&
             ((local_208 = std::__cxx11::string::size(), local_208 != 0 &&
              (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0), *pcVar7 == '\n')
              ))) {
            local_208 = local_208 + -1;
            if ((local_208 != 0) &&
               (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_1a0), *pcVar7 == '\r'
               )) {
              local_208 = local_208 + -1;
            }
            std::__cxx11::string::resize((ulong)local_1a0);
          }
          std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
          operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *
                     )0x2e645b);
          std::make_shared<minja::TextNode,minja::Location&,std::__cxx11::string&>
                    (in_stack_fffffffffffffa08,in_stack_fffffffffffffa00);
          std::
          vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
          ::emplace_back<std::shared_ptr<minja::TextNode>>
                    ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                      *)in_stack_fffffffffffff9f0,
                     (shared_ptr<minja::TextNode> *)in_stack_fffffffffffff9e8);
          std::shared_ptr<minja::TextNode>::~shared_ptr((shared_ptr<minja::TextNode> *)0x2e649d);
          std::__cxx11::string::~string(local_1a0);
        }
      }
      else {
        parseTemplate(in_RDX,in_RCX,in_R8,
                      (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                      (bool)in_stack_ffffffffffffffcf);
        bVar3 = __gnu_cxx::operator==
                          ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                            *)in_stack_fffffffffffff9d8);
        bVar2 = true;
        if (!bVar3) {
          local_158[0] = __gnu_cxx::
                         __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                         ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                       *)in_stack_fffffffffffff9e8,
                                      (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
          ::operator*(local_158);
          pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                   ::operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                                 *)0x2e5be1);
          bVar2 = pTVar5->type != EndGeneration;
        }
        if (bVar2) {
          uVar10 = __cxa_allocate_exception(0x10);
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
          ::operator*(local_50);
          std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
          operator*((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                    in_stack_fffffffffffff9e0);
          unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
          __cxa_throw(uVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::
        vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
        ::emplace_back<std::shared_ptr<minja::TemplateNode>>
                  ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                    *)in_stack_fffffffffffff9f0,
                   (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffff9e8);
        std::shared_ptr<minja::TemplateNode>::~shared_ptr
                  ((shared_ptr<minja::TemplateNode> *)0x2e5ccc);
      }
    }
    else {
      parseTemplate(in_RDX,in_RCX,in_R8,
                    (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                    (bool)in_stack_ffffffffffffffcf);
      std::shared_ptr<minja::TemplateNode>::shared_ptr((shared_ptr<minja::TemplateNode> *)0x2e5839);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9e0,
                         (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9d8);
      if (bVar2) {
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(in_RCX);
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)0x2e586c);
        if (pTVar5->type == Else) {
          __gnu_cxx::
          __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
          ::operator++(in_RCX);
          parseTemplate(in_RDX,in_RCX,in_R8,
                        (TemplateTokenIterator *)CONCAT17(bVar1,in_stack_ffffffffffffffd0),
                        (bool)in_stack_ffffffffffffffcf);
          std::shared_ptr<minja::TemplateNode>::operator=
                    (in_stack_fffffffffffff9e0,
                     (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffff9d8);
          std::shared_ptr<minja::TemplateNode>::~shared_ptr
                    ((shared_ptr<minja::TemplateNode> *)0x2e58e2);
        }
      }
      bVar3 = __gnu_cxx::operator==
                        ((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9e0,
                         (__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                          *)in_stack_fffffffffffff9d8);
      bVar2 = true;
      if (!bVar3) {
        local_130[0] = __gnu_cxx::
                       __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                       ::operator++((__normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
                                     *)in_stack_fffffffffffff9e8,
                                    (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(local_130);
        pTVar5 = std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::
                 operator->((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>
                             *)0x2e5967);
        bVar2 = pTVar5->type != EndFor;
      }
      if (bVar2) {
        uVar10 = __cxa_allocate_exception(0x10);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_*,_std::vector<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>,_std::allocator<std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>_>_>_>
        ::operator*(local_50);
        std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::operator*
                  ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                   in_stack_fffffffffffff9e0);
        unterminated(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
        __cxa_throw(uVar10,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_>::operator->
                ((unique_ptr<minja::TemplateToken,_std::default_delete<minja::TemplateToken>_> *)
                 0x2e5a28);
      in_stack_fffffffffffff9d8 = (shared_ptr<minja::SequenceNode> *)(local_f8 + 0x68);
      in_stack_fffffffffffff9e0 = local_118;
      std::
      make_shared<minja::ForNode,minja::Location&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::Expression>,std::shared_ptr<minja::TemplateNode>,bool&,std::shared_ptr<minja::TemplateNode>>
                (in_stack_fffffffffffffa40,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffa38,
                 (shared_ptr<minja::Expression> *)in_stack_fffffffffffffa30,
                 in_stack_fffffffffffffa28,
                 (shared_ptr<minja::TemplateNode> *)in_stack_fffffffffffffa20,
                 in_stack_fffffffffffffa60,in_stack_fffffffffffffa68);
      std::
      vector<std::shared_ptr<minja::TemplateNode>,std::allocator<std::shared_ptr<minja::TemplateNode>>>
      ::emplace_back<std::shared_ptr<minja::ForNode>>
                ((vector<std::shared_ptr<minja::TemplateNode>,_std::allocator<std::shared_ptr<minja::TemplateNode>_>_>
                  *)in_stack_fffffffffffff9f0,
                 (shared_ptr<minja::ForNode> *)in_stack_fffffffffffff9e8);
      std::shared_ptr<minja::ForNode>::~shared_ptr((shared_ptr<minja::ForNode> *)0x2e5a9d);
      std::shared_ptr<minja::TemplateNode>::~shared_ptr((shared_ptr<minja::TemplateNode> *)0x2e5aaa)
      ;
      std::shared_ptr<minja::TemplateNode>::~shared_ptr((shared_ptr<minja::TemplateNode> *)0x2e5ab7)
      ;
    }
  } while( true );
}

Assistant:

std::shared_ptr<TemplateNode> parseTemplate(
          const TemplateTokenIterator & begin,
          TemplateTokenIterator & it,
          const TemplateTokenIterator & end,
          bool fully = false) const {
        std::vector<std::shared_ptr<TemplateNode>> children;
        while (it != end) {
          const auto start = it;
          const auto & token = *(it++);
          if (auto if_token = dynamic_cast<IfTemplateToken*>(token.get())) {
              std::vector<std::pair<std::shared_ptr<Expression>, std::shared_ptr<TemplateNode>>> cascade;
              cascade.emplace_back(std::move(if_token->condition), parseTemplate(begin, it, end));

              while (it != end && (*it)->type == TemplateToken::Type::Elif) {
                  auto elif_token = dynamic_cast<ElifTemplateToken*>((*(it++)).get());
                  cascade.emplace_back(std::move(elif_token->condition), parseTemplate(begin, it, end));
              }

              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                cascade.emplace_back(nullptr, parseTemplate(begin, ++it, end));
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndIf) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<IfNode>(token->location, std::move(cascade)));
          } else if (auto for_token = dynamic_cast<ForTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              auto else_body = std::shared_ptr<TemplateNode>();
              if (it != end && (*it)->type == TemplateToken::Type::Else) {
                else_body = parseTemplate(begin, ++it, end);
              }
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFor) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<ForNode>(token->location, std::move(for_token->var_names), std::move(for_token->iterable), std::move(for_token->condition), std::move(body), for_token->recursive, std::move(else_body)));
          } else if (dynamic_cast<GenerationTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndGeneration) {
                  throw unterminated(**start);
              }
              // Treat as a no-op, as our scope is templates for inference, not training (`{% generation %}` wraps generated tokens for masking).
              children.emplace_back(std::move(body));
          } else if (auto text_token = dynamic_cast<TextTemplateToken*>(token.get())) {
              SpaceHandling pre_space = (it - 1) != begin ? (*(it - 2))->post_space : SpaceHandling::Keep;
              SpaceHandling post_space = it != end ? (*it)->pre_space : SpaceHandling::Keep;

              auto text = text_token->text;
              if (post_space == SpaceHandling::Strip) {
                static std::regex trailing_space_regex(R"(\s+$)");
                text = std::regex_replace(text, trailing_space_regex, "");
              } else if (options.lstrip_blocks && it != end) {
                auto i = text.size();
                while (i > 0 && (text[i - 1] == ' ' || text[i - 1] == '\t')) i--;
                if ((i == 0 && (it - 1) == begin) || (i > 0 && text[i - 1] == '\n')) {
                  text.resize(i);
                }
              }
              if (pre_space == SpaceHandling::Strip) {
                static std::regex leading_space_regex(R"(^\s+)");
                text = std::regex_replace(text, leading_space_regex, "");
              } else if (options.trim_blocks && (it - 1) != begin && !dynamic_cast<ExpressionTemplateToken*>((*(it - 2)).get())) {
                if (!text.empty() && text[0] == '\n') {
                  text.erase(0, 1);
                }
              }
              if (it == end && !options.keep_trailing_newline) {
                auto i = text.size();
                if (i > 0 && text[i - 1] == '\n') {
                  i--;
                  if (i > 0 && text[i - 1] == '\r') i--;
                  text.resize(i);
                }
              }
              children.emplace_back(std::make_shared<TextNode>(token->location, text));
          } else if (auto expr_token = dynamic_cast<ExpressionTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<ExpressionNode>(token->location, std::move(expr_token->expr)));
          } else if (auto set_token = dynamic_cast<SetTemplateToken*>(token.get())) {
            if (set_token->value) {
              children.emplace_back(std::make_shared<SetNode>(token->location, set_token->ns, set_token->var_names, std::move(set_token->value)));
            } else {
              auto value_template = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndSet) {
                  throw unterminated(**start);
              }
              if (!set_token->ns.empty()) throw std::runtime_error("Namespaced set not supported in set with template value");
              if (set_token->var_names.size() != 1) throw std::runtime_error("Structural assignment not supported in set with template value");
              auto & name = set_token->var_names[0];
              children.emplace_back(std::make_shared<SetTemplateNode>(token->location, name, std::move(value_template)));
            }
          } else if (auto macro_token = dynamic_cast<MacroTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndMacro) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<MacroNode>(token->location, std::move(macro_token->name), std::move(macro_token->params), std::move(body)));
          } else if (auto filter_token = dynamic_cast<FilterTemplateToken*>(token.get())) {
              auto body = parseTemplate(begin, it, end);
              if (it == end || (*(it++))->type != TemplateToken::Type::EndFilter) {
                  throw unterminated(**start);
              }
              children.emplace_back(std::make_shared<FilterNode>(token->location, std::move(filter_token->filter), std::move(body)));
          } else if (dynamic_cast<CommentTemplateToken*>(token.get())) {
              // Ignore comments
          } else if (auto ctrl_token = dynamic_cast<LoopControlTemplateToken*>(token.get())) {
              children.emplace_back(std::make_shared<LoopControlNode>(token->location, ctrl_token->control_type));
          } else if (dynamic_cast<EndForTemplateToken*>(token.get())
                  || dynamic_cast<EndSetTemplateToken*>(token.get())
                  || dynamic_cast<EndMacroTemplateToken*>(token.get())
                  || dynamic_cast<EndFilterTemplateToken*>(token.get())
                  || dynamic_cast<EndIfTemplateToken*>(token.get())
                  || dynamic_cast<ElseTemplateToken*>(token.get())
                  || dynamic_cast<EndGenerationTemplateToken*>(token.get())
                  || dynamic_cast<ElifTemplateToken*>(token.get())) {
              it--;  // unconsume the token
              break;  // exit the loop
          } else {
              throw unexpected(**(it-1));
          }
        }
        if (fully && it != end) {
            throw unexpected(**it);
        }
        if (children.empty()) {
          return std::make_shared<TextNode>(Location { template_str, 0 }, std::string());
        } else if (children.size() == 1) {
          return std::move(children[0]);
        } else {
          return std::make_shared<SequenceNode>(children[0]->location(), std::move(children));
        }
    }